

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raster.cpp
# Opt level: O0

void rw::conv_ARGB1555_from_RGBA5551(uint8 *out,uint8 *in)

{
  uint8 uVar1;
  byte bVar2;
  uint uVar3;
  uint32 a;
  uint32 b;
  uint32 g;
  uint32 r;
  uint8 *in_local;
  uint8 *out_local;
  
  uVar1 = *in;
  uVar3 = (in[1] & 7) << 2;
  bVar2 = in[1];
  *out = (byte)((int)(uint)*in >> 1) & 0x1f | (byte)((uVar3 | (int)(uint)*in >> 6) << 5);
  out[1] = (byte)(uVar3 >> 3) | (byte)(((int)(uint)bVar2 >> 3) << 2) | uVar1 << 7;
  return;
}

Assistant:

void
conv_ARGB1555_from_RGBA5551(uint8 *out, uint8 *in)
{
	uint32 r, g, b, a;
	a = in[0] & 1;
	b = (in[0]>>1) & 0x1F;
	g = (in[1]&7)<<2 | ((in[0]>>6)&3);
	r = (in[1]>>3) & 0x1F;
	out[0] = b | g<<5;
	out[1] = g>>3 | r<<2 | a<<7;
}